

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O0

cmExternalMakefileProjectGenerator * __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmGlobalKdevelopGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmGlobalKdevelopGenerator> *this)

{
  cmGlobalKdevelopGenerator *this_00;
  string local_48;
  cmGlobalKdevelopGenerator *local_18;
  cmGlobalKdevelopGenerator *p;
  cmExternalMakefileProjectGeneratorSimpleFactory<cmGlobalKdevelopGenerator> *this_local;
  
  p = (cmGlobalKdevelopGenerator *)this;
  this_00 = (cmGlobalKdevelopGenerator *)operator_new(0x60);
  cmGlobalKdevelopGenerator::cmGlobalKdevelopGenerator(this_00);
  local_18 = this_00;
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
            (&local_48,&this->super_cmExternalMakefileProjectGeneratorFactory);
  cmExternalMakefileProjectGenerator::SetName
            ((cmExternalMakefileProjectGenerator *)this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return &local_18->super_cmExternalMakefileProjectGenerator;
}

Assistant:

cmExternalMakefileProjectGenerator* CreateExternalMakefileProjectGenerator()
    const CM_OVERRIDE
  {
    T* p = new T;
    p->SetName(GetName());
    return p;
  }